

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreePrevious(BtCursor *pCur)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  MemPage *pMVar6;
  undefined8 in_RSI;
  
  bVar3 = pCur->eState;
  if (bVar3 != 0) {
    if (2 < bVar3) {
      iVar4 = btreeRestoreCursorPosition(pCur);
      if (iVar4 != 0) {
        return iVar4;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 1) {
      return 0x65;
    }
    if ((bVar3 == 2) && (pCur->eState = '\0', pCur->skipNext < 0)) {
      return 0;
    }
  }
  iVar4 = (int)in_RSI;
  pMVar6 = pCur->pPage;
  uVar1 = pCur->ix;
  if (pMVar6->leaf == '\0') {
    uVar2 = *(uint *)(pMVar6->aData +
                     (CONCAT11(pMVar6->aCellIdx[(ulong)uVar1 * 2],
                               pMVar6->aCellIdx[(ulong)uVar1 * 2 + 1]) & pMVar6->maskPage));
    iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
    if (iVar5 == 0) {
      iVar4 = moveToRightmost(pCur);
      return iVar4;
    }
  }
  else {
    if (uVar1 == 0) {
      do {
        if (pCur->iPage == '\0') {
          pCur->eState = '\x01';
          return 0x65;
        }
        moveToParent(pCur);
        iVar4 = (int)in_RSI;
        uVar1 = pCur->ix;
      } while (uVar1 == 0);
      pMVar6 = pCur->pPage;
    }
    pCur->ix = uVar1 - 1;
    iVar5 = 0;
    if ((pMVar6->intKey != '\0') && (pMVar6->leaf == '\0')) {
      iVar4 = sqlite3BtreePrevious(pCur,iVar4);
      return iVar4;
    }
  }
  return iVar5;
}

Assistant:

static SQLITE_NOINLINE int btreePrevious(BtCursor *pCur){
  int rc;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & (BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey))==0 );
  assert( pCur->info.nSize==0 );
  if( pCur->eState!=CURSOR_VALID ){
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( CURSOR_SKIPNEXT==pCur->eState ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext<0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->ix;
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ) return rc;
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->ix==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
    }
    assert( pCur->info.nSize==0 );
    assert( (pCur->curFlags & (BTCF_ValidOvfl))==0 );

    pCur->ix--;
    pPage = pCur->pPage;
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, 0);
    }else{
      rc = SQLITE_OK;
    }
  }
  return rc;
}